

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::timerEvent(QTreeView *this,QTimerEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QWidget *pQVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  LayoutDirection LVar10;
  int iVar11;
  State SVar12;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  QRect QVar15;
  QPoint pos;
  undefined1 local_68 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(int *)(event + 0x10) == *(int *)(lVar5 + 0x5f8)) {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x268))(this);
    QBasicTimer::stop();
    QVar15 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    uVar9 = *(int *)(lVar5 + 0x610) - 1;
    local_68 = ZEXT816(0xffffffffffffffff) << 0x40;
    if (-1 < (int)uVar9) {
      lVar13 = *(long *)(*(long *)(lVar5 + 0x2b0) + 0x20);
      iVar1 = *(int *)(lVar13 + 0x20);
      iVar2 = *(int *)(lVar13 + 0x1c);
      iVar3 = *(int *)(lVar13 + 0x14);
      iVar4 = *(int *)(lVar13 + 0x18);
      lVar13 = (ulong)uVar9 + 1;
      do {
        iVar11 = *(int *)(*(long *)(lVar5 + 0x608) + -4 + lVar13 * 4);
        local_68 = (undefined1  [16])QVar15;
        uVar9 = QHeaderView::sectionViewportPosition
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x590),iVar11);
        LVar10 = QWidget::layoutDirection((QWidget *)this);
        if (LVar10 == RightToLeft) {
          iVar11 = QHeaderView::sectionSize
                             (*(QHeaderView **)
                               (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget.field_0x8 + 0x590),iVar11);
          local_48.x1.m_i = 0;
          local_48.y1.m_i = 0;
          local_48.x2.m_i = iVar11 + uVar9 + -1;
        }
        else {
          local_48.y1.m_i = 0;
          local_48.x1.m_i = uVar9;
          local_48.x2.m_i = iVar2 - iVar3;
        }
        local_48.y2.m_i = iVar1 - iVar4;
        QVar15 = (QRect)QRect::operator|((QRect *)local_68,&local_48);
        lVar14 = lVar13 + -1;
        bVar7 = 0 < lVar13;
        lVar13 = lVar14;
        local_68 = (undefined1  [16])QVar15;
      } while (lVar14 != 0 && bVar7);
    }
    pQVar6 = *(QWidget **)(lVar5 + 0x2b0);
    local_48 = (QRect)QRect::normalized();
    QWidget::update(pQVar6,&local_48);
    QList<int>::clear((QList<int> *)(lVar5 + 0x600));
  }
  else if (*(int *)(event + 0x10) == *(int *)(lVar5 + 0x61c)) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = *(QWidget **)(lVar5 + 0x2b0);
    local_68._0_8_ = QCursor::pos();
    local_48._0_8_ = QWidget::mapFromGlobal(pQVar6,(QPoint *)local_68);
    SVar12 = QAbstractItemView::state((QAbstractItemView *)this);
    if (SVar12 == DraggingState) {
      lVar5 = *(long *)(*(long *)(lVar5 + 0x2b0) + 0x20);
      local_68._8_8_ =
           CONCAT44(*(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18),
                    *(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14));
      local_68._0_4_ = 0;
      local_68._4_4_ = 0;
      cVar8 = QRect::contains((QPoint *)local_68,SUB81(&local_48,0));
      if (cVar8 != '\0') {
        local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x1f0))
                  ((QModelIndex *)local_68,this,&local_48);
        expand(this,(QModelIndex *)local_68);
      }
    }
    QBasicTimer::stop();
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::timerEvent(QTimerEvent *event)
{
    Q_D(QTreeView);
    if (event->id() == d->columnResizeTimer.id()) {
        updateGeometries();
        d->columnResizeTimer.stop();
        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        for (int i = d->columnsToUpdate.size() - 1; i >= 0; --i) {
            int column = d->columnsToUpdate.at(i);
            int x = columnViewportPosition(column);
            if (isRightToLeft())
                rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
            else
                rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
        }
        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    } else if (event->timerId() == d->openTimer.timerId()) {
        QPoint pos = d->viewport->mapFromGlobal(QCursor::pos());
        if (state() == QAbstractItemView::DraggingState
            && d->viewport->rect().contains(pos)) {
            QModelIndex index = indexAt(pos);
            expand(index);
        }
        d->openTimer.stop();
    }

    QAbstractItemView::timerEvent(event);
}